

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::metatype> * __thiscall
mpt::reference<mpt::metatype>::operator=
          (reference<mpt::metatype> *this,reference<mpt::metatype> *ref)

{
  long lVar1;
  metatype *local_28;
  metatype *r;
  reference<mpt::metatype> *ref_local;
  reference<mpt::metatype> *this_local;
  
  local_28 = ref->_ref;
  if (local_28 != this->_ref) {
    if ((local_28 != (metatype *)0x0) &&
       (lVar1 = (**(code **)(*(long *)local_28 + 0x10))(), lVar1 == 0)) {
      local_28 = (metatype *)0x0;
    }
    if (this->_ref != (metatype *)0x0) {
      (**(code **)(*(long *)this->_ref + 8))();
    }
    this->_ref = local_28;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}